

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O1

ssh_key * opensshcert_ca_pub_key(opensshcert_key *ck,ptrlen sig,ptrlen *algname)

{
  uchar *puVar1;
  size_t sVar2;
  ssh_keyalg *psVar3;
  ssh_key *psVar4;
  uchar *puVar5;
  uchar *puVar6;
  size_t sVar7;
  ptrlen pVar8;
  ptrlen blob;
  ptrlen pVar9;
  
  puVar5 = (uchar *)sig.ptr;
  puVar1 = ck->signature_key->u;
  puVar6 = puVar5;
  if (puVar5 == (uchar *)0x0) {
    puVar6 = puVar1;
  }
  sVar2 = ck->signature_key->len;
  sVar7 = sig.len;
  if (puVar5 == (uchar *)0x0) {
    sVar7 = sVar2;
  }
  if (algname != (ptrlen *)0x0) {
    pVar9.len = sVar7;
    pVar9.ptr = puVar6;
    pVar9 = pubkey_blob_to_alg_name(pVar9);
    *algname = pVar9;
  }
  blob.len = sVar7;
  blob.ptr = puVar6;
  psVar3 = pubkey_blob_to_alg(blob);
  if (psVar3 != (ssh_keyalg *)0x0) {
    pVar8.len = sVar2;
    pVar8.ptr = puVar1;
    psVar4 = (*psVar3->new_pub)(psVar3,pVar8);
    return psVar4;
  }
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *opensshcert_ca_pub_key(
    opensshcert_key *ck, ptrlen sig, ptrlen *algname)
{
    ptrlen ca_keyblob = ptrlen_from_strbuf(ck->signature_key);

    ptrlen alg_source = sig.ptr ? sig : ca_keyblob;
    if (algname)
        *algname = pubkey_blob_to_alg_name(alg_source);

    const ssh_keyalg *ca_alg = pubkey_blob_to_alg(alg_source);
    if (!ca_alg)
        return NULL;  /* don't even recognise the certifying key type */

    return ssh_key_new_pub(ca_alg, ca_keyblob);
}